

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<char_const(&)[10],unsigned_int&,int>
          (ValidationContext *this,IssueError *issue,char (*args) [10],uint *args_1,int *args_2)

{
  format_args args_00;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  char *pcVar2;
  char (*in_RCX) [10];
  v10 *in_RDX;
  undefined1 *in_RSI;
  size_t in_RDI;
  uint *in_R8;
  ValidationReport *in_stack_fffffffffffffe38;
  ValidationReport *this_00;
  allocator<char> *in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> local_169;
  undefined1 local_168;
  undefined2 local_166;
  undefined1 auStack_140 [48];
  v10 *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
  local_f8;
  undefined8 local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
  *local_b8;
  uint *local_a0;
  char (*local_98) [10];
  v10 *local_90;
  undefined1 local_88 [16];
  ValidationReport *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
  *local_10;
  undefined8 *local_8;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  auStack_140._32_8_ = in_R8;
  auStack_140._40_8_ = in_RCX;
  local_110 = in_RDX;
  local_108._M_allocated_capacity = (size_type)in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  pcVar2 = (char *)(in_RDI + 8);
  local_168 = *(undefined1 *)local_108._M_allocated_capacity;
  local_166 = *(undefined2 *)(local_108._M_allocated_capacity + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  this_00 = (ValidationReport *)auStack_140;
  local_60 = (undefined8 *)(local_108._M_allocated_capacity + 0x18);
  local_58 = &stack0xfffffffffffffe70;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_108._M_allocated_capacity + 0x20);
  s._M_str = pcVar2;
  s._M_len = in_RDI;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)this_00,s);
  local_8 = local_60;
  local_90 = local_110;
  local_98 = (char (*) [10])auStack_140._40_8_;
  local_a0 = (uint *)auStack_140._32_8_;
  local_50 = local_88;
  local_78 = this_00;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[10],unsigned_int,int>
            (&local_f8,local_110,(char (*) [10])auStack_140._40_8_,(uint *)auStack_140._32_8_,
             (int *)this_00);
  local_30 = &local_c0;
  local_38 = &local_f8;
  local_20 = 300;
  local_c0 = 300;
  fmt.size_ = (size_t)issue;
  fmt.data_ = *args;
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_1;
  args_00.desc_ = (unsigned_long_long)args_2;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_b8 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)this_00,in_stack_fffffffffffffe38);
  ValidationReport::~ValidationReport(this_00);
  std::allocator<char>::~allocator(&local_169);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }